

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_modifier.cpp
# Opt level: O0

bool __thiscall duckdb::DistinctModifier::Equals(DistinctModifier *this,ResultModifier *other_p)

{
  bool bVar1;
  DistinctModifier *a;
  ResultModifier *in_RSI;
  ResultModifier *in_RDI;
  DistinctModifier *other;
  ResultModifier *in_stack_00000020;
  undefined1 local_1;
  
  bVar1 = ResultModifier::Equals(in_RDI,in_RSI);
  if (bVar1) {
    a = ResultModifier::Cast<duckdb::DistinctModifier>(in_stack_00000020);
    bVar1 = ExpressionUtil::ListEquals
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)a,(vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                             *)in_RDI);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DistinctModifier::Equals(const ResultModifier &other_p) const {
	if (!ResultModifier::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<DistinctModifier>();
	if (!ExpressionUtil::ListEquals(distinct_on_targets, other.distinct_on_targets)) {
		return false;
	}
	return true;
}